

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::insertAt
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t index,
          Expression *item)

{
  size_t sVar1;
  ulong local_28;
  size_t i;
  Expression *item_local;
  size_t index_local;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_local;
  
  sVar1 = size(this);
  if (index <= sVar1) {
    sVar1 = size(this);
    resize(this,sVar1 + 1);
    sVar1 = size(this);
    while (local_28 = sVar1 - 1, index < local_28) {
      this->data[local_28] = this->data[sVar1 - 2];
      sVar1 = local_28;
    }
    this->data[index] = item;
    return;
  }
  __assert_fail("index <= size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0x174,
                "void ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::insertAt(size_t, T) [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

void insertAt(size_t index, T item) {
    assert(index <= size()); // appending is ok
    resize(size() + 1);
    for (auto i = size() - 1; i > index; --i) {
      data[i] = data[i - 1];
    }
    data[index] = item;
  }